

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O0

Amount __thiscall
cfd::CoinSelectionOption::GetDustFeeAmount(CoinSelectionOption *this,Address *address)

{
  undefined1 uVar1;
  undefined8 extraout_RDX;
  Address *in_RSI;
  long in_RDI;
  Amount AVar2;
  uint32_t size;
  TxOutReference txout_ref;
  TxOut txout;
  Script locking_script;
  FeeCalculator dust_fee;
  undefined7 in_stack_fffffffffffffea0;
  uint64_t local_148;
  undefined8 in_stack_fffffffffffffec8;
  uint32_t size_00;
  undefined1 in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed1;
  AbstractTxOutReference local_120;
  Amount local_c0;
  TxOut local_b0;
  Script local_60;
  FeeCalculator local_24;
  Address *local_20;
  int64_t local_10;
  undefined1 local_8;
  
  size_00 = (uint32_t)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  if (*(long *)(in_RDI + 0x28) < 1) {
    local_148 = 3000;
  }
  else {
    local_148 = *(uint64_t *)(in_RDI + 0x28);
  }
  local_20 = in_RSI;
  FeeCalculator::FeeCalculator(&local_24,local_148);
  core::Address::GetLockingScript(&local_60,local_20);
  core::Amount::Amount(&local_c0);
  core::TxOut::TxOut(&local_b0,&local_c0,&local_60);
  core::TxOutReference::TxOutReference((TxOutReference *)&local_120,&local_b0);
  core::AbstractTxOutReference::GetSerializeSize(&local_120);
  core::Script::IsWitnessProgram(&local_60);
  AVar2 = FeeCalculator::GetFee
                    ((FeeCalculator *)CONCAT71(in_stack_fffffffffffffed1,in_stack_fffffffffffffed0),
                     size_00);
  local_10 = AVar2.amount_;
  uVar1 = AVar2.ignore_check_;
  local_8 = uVar1;
  core::TxOutReference::~TxOutReference((TxOutReference *)0x558792);
  core::TxOut::~TxOut((TxOut *)0x55879f);
  core::Script::~Script((Script *)CONCAT17(uVar1,in_stack_fffffffffffffea0));
  AVar2._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  AVar2.ignore_check_ = (bool)local_8;
  AVar2.amount_ = local_10;
  return AVar2;
}

Assistant:

Amount CoinSelectionOption::GetDustFeeAmount(const Address& address) const {
  FeeCalculator dust_fee(
      (dust_fee_rate_ <= 0) ? kDustRelayTxFeeRate : dust_fee_rate_);
  Script locking_script = address.GetLockingScript();
  TxOut txout(Amount(), locking_script);
  TxOutReference txout_ref(txout);
  uint32_t size = txout_ref.GetSerializeSize();

  // Reference: bitcoin/src/policy/policy.cpp : GetDustThreshold()
  if (locking_script.IsWitnessProgram()) {
    // sum the sizes of the parts of a transaction input
    // with 75% segwit discount applied to the script size.
    size += (32 + 4 + 1 + (107 / kWitnessScaleFactor) + 4);
  } else {
    size += (32 + 4 + 1 + 107 + 4);  // the 148 mentioned above
  }
  return dust_fee.GetFee(size);
}